

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,PowConstraint *con,double param_2,double param_3,Context ctx)

{
  double dVar1;
  CtxVal CVar2;
  int var;
  int var_00;
  Context ctx_00;
  Context CVar3;
  long lVar4;
  
  CVar2 = (con->super_FunctionalConstraint).ctx.value_;
  if (CVar2 - CTX_ROOT < 2) {
    CVar3.value_ = CTX_MIX;
    if (1 < ctx.value_ - CTX_NEG) goto LAB_002382ca;
  }
  else {
    CVar3.value_ = ctx.value_;
    if ((CVar2 != CTX_NONE) &&
       (((CVar2 != CTX_NEG || (CTX_MIX < ctx.value_)) ||
        (CVar3.value_ = CTX_MIX, (0x16U >> (ctx.value_ & 0x1f) & 1) == 0)))) goto LAB_002382ca;
  }
  (con->super_FunctionalConstraint).ctx.value_ = CVar3.value_;
LAB_002382ca:
  var = (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
        args_._M_elems[0];
  var_00 = (con->super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>).
           args_._M_elems[1];
  dVar1 = *(double *)(*(long *)(this + 0x40) + (long)var * 8);
  CVar3.value_ = CTX_MIX;
  if (0.0 <= dVar1) {
    if (0.0 <= *(double *)(*(long *)(this + 0x40) + (long)var_00 * 8)) {
      ctx_00.value_ = CTX_POS;
      if (CTX_POS < ctx.value_) {
        ctx_00.value_ = ctx.value_;
      }
      lVar4 = *(long *)(this + 0x58);
    }
    else {
      lVar4 = *(long *)(this + 0x58);
      ctx_00.value_ = CTX_MIX;
      if (*(double *)(lVar4 + (long)var_00 * 8) <= 0.0) {
        ctx_00.value_ = CTX_NEG;
        if ((CTX_POS < ctx.value_) && (ctx_00.value_ = ctx.value_, ctx.value_ == CTX_NEG)) {
          ctx_00.value_ = CTX_POS;
        }
      }
    }
    if (*(double *)(lVar4 + (long)var * 8) <= 1.0) {
      CVar3.value_ = CTX_NEG;
      if ((CTX_POS < ctx.value_) && (CVar3.value_ = ctx.value_, ctx.value_ == CTX_NEG)) {
        CVar3.value_ = CTX_POS;
      }
    }
    else if ((1.0 <= dVar1) && (CVar3.value_ = CTX_POS, CTX_POS < ctx.value_)) {
      CVar3.value_ = ctx.value_;
    }
  }
  else {
    ctx_00.value_ = CTX_MIX;
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,var,-INFINITY,INFINITY,ctx_00);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,var_00,-INFINITY,INFINITY,CVar3);
  return;
}

Assistant:

void PropagateResult(
      PowConstraint& con, double , double , Context ctx) {
    con.AddContext(ctx);           // merge context
    auto x = con.GetArguments()[0];
    auto y = con.GetArguments()[1];
    Context ctx_x, ctx_y;
    if (MPCD( lb(x) )>=0.0 ) {     // x >= 0
      ctx_x = (MPCD( lb(y) ) >= 0.0)
                  ? +ctx
                  : MPCD( ub(y) ) <= 0.0
                        ? -ctx: Context::CTX_MIX;
      ctx_y = (MPCD( ub(x) ) <= 1.0)  // 0<=x<=1
                  ? -ctx
                  : MPCD( lb(x) ) >= 1.0  // x>=1
                        ? +ctx
                        : Context::CTX_MIX;
    } else {
      ctx_x = ctx_y = Context::CTX_MIX;
    }
    VarArray1 xx {x};
    PropagateResult2Args(xx,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_x);
    VarArray1 yy {y};
    PropagateResult2Args(yy,
                         MPD( MinusInfty() ), MPD( Infty() ),
                         ctx_y);
  }